

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

void re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  ParseFlags PVar1;
  RegexpOp RVar2;
  int iVar3;
  int iVar4;
  Regexp **ppRVar5;
  Regexp *pRVar6;
  ostream *poVar7;
  Rune *pRVar8;
  long lVar9;
  bool bVar10;
  LogMessage local_348;
  int local_1c4;
  Rune local_1c0;
  int n;
  Rune r;
  LogMessage local_1b0;
  Regexp *local_30;
  Regexp *nre;
  Regexp *r2;
  Regexp *r1;
  Regexp **r2ptr_local;
  Regexp **r1ptr_local;
  
  r2 = *r1ptr;
  nre = *r2ptr;
  r1 = (Regexp *)r2ptr;
  r2ptr_local = r1ptr;
  ppRVar5 = Regexp::sub(r2);
  pRVar6 = Regexp::Incref(*ppRVar5);
  PVar1 = Regexp::parse_flags(r2);
  local_30 = Regexp::Repeat(pRVar6,PVar1,0,0);
  RVar2 = Regexp::op(r2);
  switch(RVar2) {
  case kRegexpStar:
    (local_30->field_7).field_0.min_ = 0;
    (local_30->field_7).field_0.max_ = -1;
    break;
  case kRegexpPlus:
    (local_30->field_7).field_0.min_ = 1;
    (local_30->field_7).field_0.max_ = -1;
    break;
  case kRegexpQuest:
    (local_30->field_7).field_0.min_ = 0;
    (local_30->field_7).field_0.max_ = 1;
    break;
  case kRegexpRepeat:
    iVar3 = Regexp::min(r2);
    (local_30->field_7).field_0.min_ = iVar3;
    iVar3 = Regexp::max(r2);
    (local_30->field_7).field_0.max_ = iVar3;
    break;
  default:
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x167);
    poVar7 = LogMessage::stream(&local_1b0);
    poVar7 = std::operator<<(poVar7,"DoCoalesce failed: r1->op() is ");
    RVar2 = Regexp::op(r2);
    std::ostream::operator<<(poVar7,RVar2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    Regexp::Decref(local_30);
    return;
  }
  RVar2 = Regexp::op(nre);
  switch(RVar2) {
  case kRegexpLiteral:
  case kRegexpAnyChar:
  case kRegexpAnyByte:
  case kRegexpCharClass:
    (local_30->field_7).field_0.min_ = (local_30->field_7).field_0.min_ + 1;
    iVar3 = Regexp::max(local_30);
    if (iVar3 != -1) {
      (local_30->field_7).field_0.max_ = (local_30->field_7).field_0.max_ + 1;
    }
    break;
  case kRegexpLiteralString:
    ppRVar5 = Regexp::sub(r2);
    local_1c0 = Regexp::rune(*ppRVar5);
    local_1c4 = 1;
    while( true ) {
      iVar3 = local_1c4;
      iVar4 = Regexp::nrunes(nre);
      bVar10 = false;
      if (iVar3 < iVar4) {
        pRVar8 = Regexp::runes(nre);
        bVar10 = pRVar8[local_1c4] == local_1c0;
      }
      if (!bVar10) break;
      local_1c4 = local_1c4 + 1;
    }
    (local_30->field_7).field_0.min_ = local_1c4 + (local_30->field_7).field_0.min_;
    iVar4 = Regexp::max(local_30);
    iVar3 = local_1c4;
    if (iVar4 != -1) {
      (local_30->field_7).field_0.max_ = local_1c4 + (local_30->field_7).field_0.max_;
    }
    iVar4 = Regexp::nrunes(nre);
    if (iVar3 != iVar4) {
      *r2ptr_local = local_30;
      pRVar8 = Regexp::runes(nre);
      lVar9 = (long)local_1c4;
      iVar3 = Regexp::nrunes(nre);
      iVar3 = iVar3 - local_1c4;
      PVar1 = Regexp::parse_flags(nre);
      pRVar6 = Regexp::LiteralString(pRVar8 + lVar9,iVar3,PVar1);
      *(Regexp **)r1 = pRVar6;
      goto LAB_0015a85d;
    }
    break;
  default:
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x1a4);
    poVar7 = LogMessage::stream(&local_348);
    poVar7 = std::operator<<(poVar7,"DoCoalesce failed: r2->op() is ");
    RVar2 = Regexp::op(nre);
    std::ostream::operator<<(poVar7,RVar2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_348);
    Regexp::Decref(local_30);
    return;
  case kRegexpStar:
    (local_30->field_7).field_0.max_ = -1;
    break;
  case kRegexpPlus:
    (local_30->field_7).field_0.min_ = (local_30->field_7).field_0.min_ + 1;
    (local_30->field_7).field_0.max_ = -1;
    break;
  case kRegexpQuest:
    iVar3 = Regexp::max(local_30);
    if (iVar3 != -1) {
      (local_30->field_7).field_0.max_ = (local_30->field_7).field_0.max_ + 1;
    }
    break;
  case kRegexpRepeat:
    iVar3 = Regexp::min(nre);
    (local_30->field_7).field_0.min_ = iVar3 + (local_30->field_7).field_0.min_;
    iVar3 = Regexp::max(nre);
    if (iVar3 == -1) {
      (local_30->field_7).field_0.max_ = -1;
    }
    else {
      iVar3 = Regexp::max(local_30);
      if (iVar3 != -1) {
        iVar3 = Regexp::max(nre);
        (local_30->field_7).field_0.max_ = iVar3 + (local_30->field_7).field_0.max_;
      }
    }
  }
  pRVar6 = (Regexp *)operator_new(0x28);
  Regexp::Regexp(pRVar6,kRegexpEmptyMatch,NoParseFlags);
  *r2ptr_local = pRVar6;
  *(Regexp **)r1 = local_30;
LAB_0015a85d:
  Regexp::Decref(r2);
  Regexp::Decref(nre);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->min_ = 0;
      nre->max_ = -1;
      break;

    case kRegexpPlus:
      nre->min_ = 1;
      nre->max_ = -1;
      break;

    case kRegexpQuest:
      nre->min_ = 0;
      nre->max_ = 1;
      break;

    case kRegexpRepeat:
      nre->min_ = r1->min();
      nre->max_ = r1->max();
      break;

    default:
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      nre->Decref();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->min_++;
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->min_ += r2->min();
      if (r2->max() == -1)
        nre->max_ = -1;
      else if (nre->max() != -1)
        nre->max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->min_++;
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->min_ += n;
      if (nre->max() != -1)
        nre->max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      nre->Decref();
      return;
  }

  r1->Decref();
  r2->Decref();
}